

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void getDWPTCoeffs(wpt_object wt,int X,int Y,double *coeffs,int N)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  char *__format;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if ((X < 1) || (uVar4 = wt->J, (int)uVar4 < X)) {
    uVar4 = wt->J;
    __format = "X co-ordinate must be >= 1 and <= %d";
  }
  else {
    iVar2 = 1;
    iVar5 = X;
    do {
      iVar2 = iVar2 * 2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if ((-1 < Y) && (Y < iVar2)) {
      if (X < (int)uVar4) {
        iVar2 = 0;
        iVar5 = 0;
        do {
          iVar5 = iVar5 + wt->numnodeslevel[uVar4];
          iVar2 = iVar2 + wt->numnodeslevel[uVar4] * wt->coeflength[uVar4];
          uVar4 = uVar4 - 1;
        } while (X < (int)uVar4);
        lVar6 = (long)iVar5;
      }
      else {
        lVar6 = 0;
        iVar2 = 0;
      }
      if (0 < wt->numnodeslevel[(uint)X]) {
        lVar7 = 0;
        do {
          if (wt->nodeindex[lVar6 * 2 + lVar7 * 2 + 1] == Y) {
            if (0 < N) {
              pdVar1 = wt->output;
              uVar3 = 0;
              do {
                coeffs[uVar3] = pdVar1[(long)iVar2 + uVar3];
                uVar3 = uVar3 + 1;
              } while ((uint)N != uVar3);
            }
            return;
          }
          iVar2 = iVar2 + wt->coeflength[(uint)X];
          lVar7 = lVar7 + 1;
        } while (wt->numnodeslevel[(uint)X] != (int)lVar7);
      }
      puts(
          "The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes "
          );
      goto LAB_00105174;
    }
    uVar4 = iVar2 - 1;
    __format = "Y co-ordinate must be >= 0 and <= %d";
  }
  printf(__format,(ulong)uVar4);
LAB_00105174:
  exit(-1);
}

Assistant:

void getDWPTCoeffs(wpt_object wt, int X, int Y, double *coeffs, int N) {
	int ymax, i;
	int np,citer;
	int flag;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 || Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	np = 0;
	citer = 0;

	for (i = wt->J; i > X; --i) {
		np += wt->numnodeslevel[i];
		citer += wt->numnodeslevel[i] * wt->coeflength[i];
	}

	i = 0;
	flag = 0;
	for (i = 0; i < wt->numnodeslevel[X]; ++i) {
		if (wt->nodeindex[2 * np + 1] == Y) {
			flag = 1;
			break;
		}
		np++;
		citer += wt->coeflength[X];
	}

	if (flag == 0) {
		printf("The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes \n");
		exit(-1);
	}

	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[citer + i];
	}

}